

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelwriter.h
# Opt level: O0

void Randomize(Mat *m,float a,float b)

{
  unsigned_short uVar1;
  size_t sVar2;
  float *pfVar3;
  unsigned_short *puVar4;
  size_t sVar5;
  char *pcVar6;
  Mat *in_RDI;
  float fVar7;
  size_t i_2;
  char *p_1;
  size_t i_1;
  unsigned_short *p;
  size_t i;
  undefined8 in_stack_ffffffffffffffc0;
  ulong local_38;
  ulong local_28;
  size_t local_18;
  
  if (in_RDI->elemsize == 4) {
    local_18 = 0;
    while (sVar5 = local_18, sVar2 = ncnn::Mat::total(in_RDI), sVar5 < sVar2) {
      fVar7 = RandomFloat((float)(sVar5 >> 0x20),(float)sVar5);
      pfVar3 = ncnn::Mat::operator[](in_RDI,local_18);
      *pfVar3 = fVar7;
      local_18 = local_18 + 1;
    }
  }
  else if (in_RDI->elemsize == 2) {
    puVar4 = ncnn::Mat::operator_cast_to_unsigned_short_(in_RDI);
    for (local_28 = 0; sVar5 = ncnn::Mat::total(in_RDI), local_28 < sVar5; local_28 = local_28 + 1)
    {
      fVar7 = RandomFloat((float)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                          (float)in_stack_ffffffffffffffc0);
      uVar1 = ncnn::float32_to_float16(fVar7);
      puVar4[local_28] = uVar1;
    }
  }
  else if (in_RDI->elemsize == 1) {
    pcVar6 = ncnn::Mat::operator_cast_to_signed_char_(in_RDI);
    for (local_38 = 0; sVar5 = ncnn::Mat::total(in_RDI), local_38 < sVar5; local_38 = local_38 + 1)
    {
      fVar7 = RandomFloat((float)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                          (float)in_stack_ffffffffffffffc0);
      pcVar6[local_38] = (char)(int)fVar7;
    }
  }
  return;
}

Assistant:

static void Randomize(ncnn::Mat& m, float a = -1.2f, float b = 1.2f)
{
    if (m.elemsize == 4)
    {
        for (size_t i = 0; i < m.total(); i++)
        {
            m[i] = RandomFloat(a, b);
        }
    }
    else if (m.elemsize == 2)
    {
        unsigned short* p = m;
        for (size_t i = 0; i < m.total(); i++)
        {
            p[i] = ncnn::float32_to_float16(RandomFloat(a, b));
        }
    }
    else if (m.elemsize == 1)
    {
        signed char* p = m;
        for (size_t i = 0; i < m.total(); i++)
        {
            p[i] = (signed char)RandomFloat(-127, 127);
        }
    }
}